

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O1

void __thiscall gvr::PointCloud::addExtend(PointCloud *this,Vector3d *emin,Vector3d *emax)

{
  uint uVar1;
  float fVar2;
  int iVar3;
  float *pfVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  bool bVar11;
  float fVar12;
  float fVar15;
  ulong uVar13;
  double dVar14;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined4 uVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined4 uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  
  iVar3 = this->n;
  uVar1 = iVar3 * 3 - 3;
  pfVar4 = this->vertex;
  fVar29 = -3.4028235e+38;
  fVar33 = -3.4028235e+38;
  fVar19 = -3.4028235e+38;
  fVar31 = 3.4028235e+38;
  fVar30 = 3.4028235e+38;
  fVar27 = 3.4028235e+38;
  do {
    fVar16 = -3.4028235e+38;
    fVar25 = -3.4028235e+38;
    fVar32 = -3.4028235e+38;
    fVar28 = 3.4028235e+38;
    fVar17 = 3.4028235e+38;
    fVar26 = 3.4028235e+38;
    if (-1 < (int)uVar1) {
      fVar16 = -3.4028235e+38;
      fVar26 = 3.4028235e+38;
      fVar17 = 3.4028235e+38;
      uVar23 = 0;
      uVar24 = 0;
      lVar6 = (ulong)uVar1 + 3;
      fVar18 = -3.4028235e+38;
      fVar20 = 3.4028235e+38;
      fVar34 = -3.4028235e+38;
      do {
        uVar13 = *(ulong *)(pfVar4 + lVar6 + -3);
        fVar12 = (float)uVar13;
        fVar25 = fVar18;
        fVar28 = fVar20;
        fVar32 = fVar34;
        if ((((fVar33 <= fVar12) && (fVar12 < fVar31)) &&
            (fVar15 = (float)(uVar13 >> 0x20), fVar19 <= fVar15)) &&
           (((fVar15 < fVar30 && (fVar2 = pfVar4[lVar6 + -1], fVar29 <= fVar2)) && (fVar2 < fVar27))
           )) {
          auVar21._8_8_ = 0;
          auVar21._0_8_ = uVar13;
          auVar22._4_4_ = fVar17;
          auVar22._0_4_ = fVar26;
          auVar22._8_4_ = uVar23;
          auVar22._12_4_ = uVar24;
          auVar22 = minps(auVar21,auVar22);
          fVar28 = fVar2;
          if (fVar20 <= fVar2) {
            fVar28 = fVar20;
          }
          if (fVar12 <= fVar16) {
            uVar13 = CONCAT44(fVar15,fVar16);
          }
          fVar32 = fVar15;
          if (fVar15 <= fVar34) {
            fVar32 = fVar34;
          }
          fVar25 = fVar2;
          if (fVar2 <= fVar18) {
            fVar25 = fVar18;
          }
          fVar16 = (float)uVar13;
          fVar26 = auVar22._0_4_;
          fVar17 = auVar22._4_4_;
          uVar23 = auVar22._8_4_;
          uVar24 = auVar22._12_4_;
        }
        lVar6 = lVar6 + -3;
        fVar18 = fVar25;
        fVar20 = fVar28;
        fVar34 = fVar32;
      } while (2 < lVar6);
    }
    bVar11 = false;
    if (((fVar26 <= fVar16) && (fVar17 <= fVar32)) && (bVar11 = false, fVar28 <= fVar25)) {
      fVar20 = (fVar16 + fVar26) * 0.5;
      fVar34 = (fVar32 + fVar17) * 0.5;
      fVar18 = (fVar25 + fVar28) * 0.5;
      if ((int)uVar1 < 0) {
        iVar8 = 0;
        iVar10 = 0;
        iVar7 = 0;
        iVar5 = 0;
      }
      else {
        iVar5 = 0;
        iVar7 = 0;
        iVar10 = 0;
        iVar8 = 0;
        lVar6 = (ulong)uVar1 + 3;
        uVar9 = iVar3 * 3 - 1;
        do {
          fVar12 = pfVar4[lVar6 + -3];
          if (((((fVar33 <= fVar12) && (fVar12 < fVar31)) &&
               (fVar15 = pfVar4[uVar9 - 1], fVar19 <= fVar15)) &&
              ((fVar15 < fVar30 && (fVar2 = pfVar4[uVar9], fVar29 <= fVar2)))) && (fVar2 < fVar27))
          {
            iVar8 = iVar8 + (uint)(fVar12 < fVar20);
            iVar10 = iVar10 + (uint)(fVar15 < fVar34);
            iVar7 = iVar7 + (uint)(fVar2 < fVar18);
            iVar5 = iVar5 + 1;
          }
          uVar9 = uVar9 - 3;
          lVar6 = lVar6 + -3;
        } while (2 < lVar6);
      }
      fVar27 = fVar25;
      fVar29 = fVar28;
      fVar30 = fVar32;
      if (iVar3 < iVar5 * 2) {
        if (fVar16 <= fVar26) {
          bVar11 = false;
        }
        else {
          fVar19 = fVar20;
          if (iVar5 <= iVar8 * 100) {
            fVar19 = fVar26;
          }
          fVar26 = fVar19;
          bVar11 = (iVar5 - iVar8) * 100 < iVar5;
          if (bVar11) {
            fVar16 = fVar20;
          }
          bVar11 = bVar11 || iVar8 * 100 < iVar5;
        }
        if (fVar17 < fVar32) {
          if (iVar10 * 100 < iVar5) {
            bVar11 = true;
            fVar17 = fVar34;
          }
          if ((iVar5 - iVar10) * 100 < iVar5) {
            bVar11 = true;
            fVar30 = fVar34;
          }
        }
        fVar19 = fVar17;
        fVar31 = fVar16;
        fVar33 = fVar26;
        if (fVar28 < fVar25) {
          if (iVar7 * 100 < iVar5) {
            bVar11 = true;
            fVar28 = fVar18;
          }
          fVar29 = fVar28;
          if ((iVar5 - iVar7) * 100 < iVar5) {
            bVar11 = true;
            fVar27 = fVar18;
          }
        }
      }
      else {
        bVar11 = false;
        fVar19 = fVar17;
        fVar31 = fVar16;
        fVar33 = fVar26;
      }
    }
  } while (bVar11);
  dVar14 = (double)fVar33 + (this->super_Model).origin.v[0];
  if (emin->v[0] <= dVar14) {
    dVar14 = emin->v[0];
  }
  emin->v[0] = dVar14;
  dVar14 = (double)fVar19 + (this->super_Model).origin.v[1];
  if (emin->v[1] <= dVar14) {
    dVar14 = emin->v[1];
  }
  emin->v[1] = dVar14;
  dVar14 = (double)fVar29 + (this->super_Model).origin.v[2];
  if (emin->v[2] <= dVar14) {
    dVar14 = emin->v[2];
  }
  emin->v[2] = dVar14;
  dVar14 = (double)fVar31 + (this->super_Model).origin.v[0];
  if (dVar14 <= emax->v[0]) {
    dVar14 = emax->v[0];
  }
  emax->v[0] = dVar14;
  dVar14 = (double)fVar30 + (this->super_Model).origin.v[1];
  if (dVar14 <= emax->v[1]) {
    dVar14 = emax->v[1];
  }
  emax->v[1] = dVar14;
  dVar14 = (double)fVar27 + (this->super_Model).origin.v[2];
  if (dVar14 <= emax->v[2]) {
    dVar14 = emax->v[2];
  }
  emax->v[2] = dVar14;
  return;
}

Assistant:

void PointCloud::addExtend(gmath::Vector3d &emin, gmath::Vector3d &emax) const
{
  float pxmin=-std::numeric_limits<float>::max();
  float pymin=-std::numeric_limits<float>::max();
  float pzmin=-std::numeric_limits<float>::max();
  float pxmax=std::numeric_limits<float>::max();
  float pymax=std::numeric_limits<float>::max();
  float pzmax=std::numeric_limits<float>::max();

  bool repeat=true;
  while (repeat)
  {
    repeat=false;

    // compute extend

    float xmin=std::numeric_limits<float>::max();
    float ymin=std::numeric_limits<float>::max();
    float zmin=std::numeric_limits<float>::max();
    float xmax=-std::numeric_limits<float>::max();
    float ymax=-std::numeric_limits<float>::max();
    float zmax=-std::numeric_limits<float>::max();

    for (int i=3*(n-1); i>=0; i-=3)
    {
      float x=vertex[i];
      float y=vertex[i+1];
      float z=vertex[i+2];

      if (x >= pxmin && x < pxmax && y >= pymin && y < pymax && z >= pzmin && z < pzmax)
      {
        xmin=std::min(xmin, x);
        ymin=std::min(ymin, y);
        zmin=std::min(zmin, z);

        xmax=std::max(xmax, x);
        ymax=std::max(ymax, y);
        zmax=std::max(zmax, z);
      }
    }

    if (xmax >= xmin && ymax >= ymin && zmax >= zmin)
    {
      // divide range of each coordinate into two halves compute number of points
      // in each halve

      int nxmin=0;
      int nymin=0;
      int nzmin=0;
      int m=0;

      float xmean=(xmax+xmin)/2;
      float ymean=(ymax+ymin)/2;
      float zmean=(zmax+zmin)/2;

      for (int i=3*(n-1); i>=0; i-=3)
      {
        float x=vertex[i];
        float y=vertex[i+1];
        float z=vertex[i+2];

        if (x >= pxmin && x < pxmax && y >= pymin && y < pymax && z >= pzmin && z < pzmax)
        {
          if (vertex[i] < xmean)
          {
            nxmin++;
          }

          if (vertex[i+1] < ymean)
          {
            nymin++;
          }

          if (vertex[i+2] < zmean)
          {
            nzmin++;
          }

          m++;
        }
      }

      pxmin=xmin;
      pxmax=xmax;
      pymin=ymin;
      pymax=ymax;
      pzmin=zmin;
      pzmax=zmax;

      if (2*m > n)
      {
        // reduce range and try again if one half contains less than 1/100 of the
        // points

        if (pxmax > pxmin)
        {
          if (nxmin*100 < m)
          {
            pxmin=xmean;
            repeat=true;
          }

          if ((m-nxmin)*100 < m)
          {
            pxmax=xmean;
            repeat=true;
          }
        }

        if (pymax > pymin)
        {
          if (nymin*100 < m)
          {
            pymin=ymean;
            repeat=true;
          }

          if ((m-nymin)*100 < m)
          {
            pymax=ymean;
            repeat=true;
          }
        }

        if (pzmax > pzmin)
        {
          if (nzmin*100 < m)
          {
            pzmin=zmean;
            repeat=true;
          }

          if ((m-nzmin)*100 < m)
          {
            pzmax=zmean;
            repeat=true;
          }
        }
      }
    }
  }

  // add extend

  emin[0]=std::min(emin[0], getOrigin()[0]+pxmin);
  emin[1]=std::min(emin[1], getOrigin()[1]+pymin);
  emin[2]=std::min(emin[2], getOrigin()[2]+pzmin);

  emax[0]=std::max(emax[0], getOrigin()[0]+pxmax);
  emax[1]=std::max(emax[1], getOrigin()[1]+pymax);
  emax[2]=std::max(emax[2], getOrigin()[2]+pzmax);
}